

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O1

void des3_cbc3_cbc_encrypt(ssh_cipher *ciph,void *vdata,int len)

{
  ssh_cipheralg *psVar1;
  uint uVar2;
  LR LVar3;
  LR LVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  undefined1 *puVar8;
  uint uVar9;
  
  if (0 < len) {
    iVar7 = len + 8;
    puVar8 = (undefined1 *)((long)vdata + 7);
    do {
      uVar2 = *(uint *)(puVar8 + -7);
      uVar5 = *(uint *)(puVar8 + -3);
      uVar2 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      uVar6 = (uVar2 >> 4 ^ uVar5) & 0xf0f0f0f;
      uVar2 = uVar6 << 4 ^ uVar2;
      uVar6 = uVar6 ^ uVar5;
      uVar5 = uVar6 & 0xffff ^ uVar2 >> 0x10;
      uVar2 = uVar5 << 0x10 ^ uVar2;
      uVar5 = uVar5 ^ uVar6;
      uVar6 = (uVar5 >> 2 ^ uVar2) & 0x33333333;
      uVar5 = uVar6 * 4 ^ uVar5;
      uVar6 = uVar6 ^ uVar2;
      uVar2 = (uVar5 >> 8 ^ uVar6) & 0xff00ff;
      uVar5 = uVar2 << 8 ^ uVar5;
      uVar2 = uVar2 ^ uVar6;
      uVar6 = (uVar2 >> 1 ^ uVar5) & 0x55555555;
      uVar2 = uVar6 * 2 ^ uVar2;
      uVar6 = uVar6 ^ uVar5;
      LVar3 = des_inner_cipher((LR)(CONCAT44(uVar6 >> 1 | (uint)((uVar6 & 1) != 0) << 0x1f,
                                             uVar2 >> 1 | (uint)((uVar2 & 1) != 0) << 0x1f) ^
                                   (ulong)ciph[-3].vt),(des_keysched *)(ciph + -0x33),0,1);
      *(LR *)(ciph + -3) = LVar3;
      LVar4 = des_inner_cipher(LVar3,(des_keysched *)(ciph + -0x23),0xf,0xffffffffffffffff);
      psVar1 = ciph[-2].vt;
      *(LR *)(ciph + -2) = LVar3;
      LVar3 = des_inner_cipher((LR)((ulong)LVar4 ^ (ulong)psVar1 ^ (ulong)ciph[-1].vt),
                               (des_keysched *)(ciph + -0x13),0,1);
      *(LR *)(ciph + -1) = LVar3;
      uVar2 = LVar3.L;
      uVar5 = LVar3.R << 1 | (uint)((long)LVar3 < 0);
      uVar6 = (uVar2 & 0x7fffffff ^ uVar5) & 0x55555555;
      uVar9 = uVar6 * 2 ^ (uVar2 << 1 | (uint)((int)uVar2 < 0));
      uVar6 = uVar6 ^ uVar5;
      uVar2 = (uVar6 >> 8 ^ uVar9) & 0xff00ff;
      uVar6 = uVar2 << 8 ^ uVar6;
      uVar2 = uVar2 ^ uVar9;
      uVar5 = (uVar6 >> 2 ^ uVar2) & 0x33333333;
      uVar6 = uVar5 * 4 ^ uVar6;
      uVar5 = uVar5 ^ uVar2;
      uVar9 = uVar6 & 0xffff ^ uVar5 >> 0x10;
      uVar5 = uVar9 << 0x10 ^ uVar5;
      uVar9 = uVar9 ^ uVar6;
      uVar2 = (uVar5 >> 4 ^ uVar9) & 0xf0f0f0f;
      uVar5 = uVar2 << 4 ^ uVar5;
      uVar2 = uVar2 ^ uVar9;
      puVar8[-4] = (char)uVar5;
      puVar8[-5] = (char)(uVar5 >> 8);
      puVar8[-6] = (char)(uVar5 >> 0x10);
      puVar8[-7] = (char)(uVar5 >> 0x18);
      *puVar8 = (char)uVar2;
      puVar8[-1] = (char)(uVar2 >> 8);
      puVar8[-2] = (char)(uVar2 >> 0x10);
      puVar8[-3] = (char)(uVar2 >> 0x18);
      iVar7 = iVar7 + -8;
      puVar8 = puVar8 + 8;
    } while (8 < iVar7);
  }
  return;
}

Assistant:

static void des3_cbc3_cbc_encrypt(ssh_cipher *ciph, void *vdata, int len)
{
    struct des3_cbc3_ctx *ctx = container_of(ciph, struct des3_cbc3_ctx, ciph);
    uint8_t *data = (uint8_t *)vdata;
    for (; len > 0; len -= 8, data += 8) {
        /* Load and IP the input. */
        LR plaintext = des_IP(des_load_lr(data));
        LR lr = plaintext;

        /* Do three passes of CBC, with the middle one inverted. */

        lr = des_xor_lr(lr, ctx->iv[0]);
        lr = des_inner_cipher(lr, &ctx->sched[0], ENCIPHER);
        ctx->iv[0] = lr;

        LR ciphertext = lr;
        lr = des_inner_cipher(ciphertext, &ctx->sched[1], DECIPHER);
        lr = des_xor_lr(lr, ctx->iv[1]);
        ctx->iv[1] = ciphertext;

        lr = des_xor_lr(lr, ctx->iv[2]);
        lr = des_inner_cipher(lr, &ctx->sched[2], ENCIPHER);
        ctx->iv[2] = lr;

        des_store_lr(data, des_FP(lr));
    }
}